

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  void *p;
  pthread_t thread2;
  pthread_t thread1;
  void *pvStack_48;
  pthread_t local_40;
  pthread_t local_38;
  
  lVar1 = *in_FS_OFFSET + -4;
  printf("%s, %p, %i\n","main",lVar1);
  pthread_create(&local_38,(pthread_attr_t *)0x0,f,(void *)0x0);
  pthread_join(local_38,&pvStack_48);
  printf("%s, %p, %i\n","main",lVar1);
  pthread_create(&local_40,(pthread_attr_t *)0x0,f,(void *)0x0);
  pthread_join(local_40,&pvStack_48);
  printf("%s, %p, %i\n","main",lVar1,(ulong)*(uint *)((long)in_FS_OFFSET + -4));
  return 0;
}

Assistant:

int
main()
{
    pthread_t thread1;
    pthread_t thread2;
    printf("%s, %p, %i\n", __func__, &thread_i, thread_i);
    pthread_create(&thread1, NULL, f, NULL);
    void *p;
    pthread_join(thread1, &p);
    printf("%s, %p, %i\n", __func__, &thread_i, thread_i);
    pthread_create(&thread2, NULL, f, NULL);
    pthread_join(thread2, &p);
    printf("%s, %p, %i\n", __func__, &thread_i, thread_i);
    return 0;
}